

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O1

void finishFTSession(string *id,UDPClient *client)

{
  undefined8 *puVar1;
  int iVar2;
  iterator iVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  long *plVar7;
  ulong *puVar8;
  size_type *psVar9;
  ulong uVar10;
  undefined7 uVar12;
  pointer pcVar11;
  ulong *unaff_R13;
  string *path;
  undefined1 local_1d8 [8];
  string check;
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  string local_178;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  string local_98;
  string *local_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  ulong *local_50;
  long local_48;
  ulong local_40;
  long lStack_38;
  
  pthread_mutex_lock((pthread_mutex_t *)(ftSessionMutex + 1));
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)client,id);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
      ._M_cur == (__node_type *)0x0) goto LAB_00194b2d;
  if (*(FILE **)((long)iVar3.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                       ._M_cur + 0x28) != (FILE *)0x0) {
    fclose(*(FILE **)((long)iVar3.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                            ._M_cur + 0x28));
    *(undefined8 *)
     ((long)iVar3.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
            ._M_cur + 0x28) = 0;
  }
  path = (string *)
         ((long)iVar3.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                ._M_cur + 0x60);
  nite::hashFile((string *)local_1d8,path);
  if (check._M_dataplus._M_p ==
      *(pointer *)
       ((long)iVar3.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
              ._M_cur + 0x88)) {
    uVar12 = (undefined7)((ulong)local_1d8 >> 8);
    if (check._M_dataplus._M_p == (pointer)0x0) {
      pcVar11 = (pointer)CONCAT71(uVar12,1);
    }
    else {
      iVar2 = bcmp((void *)local_1d8,
                   *(void **)((long)iVar3.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                                    ._M_cur + 0x80),(size_t)check._M_dataplus._M_p);
      pcVar11 = (pointer)CONCAT71(uVar12,iVar2 == 0);
    }
  }
  else {
    pcVar11 = (pointer)0x0;
  }
  if (*(char *)((long)iVar3.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                      ._M_cur + 0xd8) == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&check.field_2 + 8),"FT ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)iVar3.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                          ._M_cur + 0x310));
    plVar4 = (long *)std::__cxx11::string::append(check.field_2._M_local_buf + 8);
    local_b8 = &local_a8;
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_a8 = *plVar7;
      lStack_a0 = plVar4[3];
    }
    else {
      local_a8 = *plVar7;
      local_b8 = (long *)*plVar4;
    }
    local_b0 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b8,
                                *(ulong *)((long)iVar3.
                                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                                                 ._M_cur + 0x80));
    local_d8 = &local_c8;
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_c8 = *plVar7;
      lStack_c0 = plVar4[3];
    }
    else {
      local_c8 = *plVar7;
      local_d8 = (long *)*plVar4;
    }
    local_d0 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_f8 = &local_e8;
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_e8 = *plVar7;
      lStack_e0 = plVar4[3];
    }
    else {
      local_e8 = *plVar7;
      local_f8 = (long *)*plVar4;
    }
    local_f0 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_118 = &local_108;
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_108 = *plVar7;
      lStack_100 = plVar4[3];
    }
    else {
      local_108 = *plVar7;
      local_118 = (long *)*plVar4;
    }
    local_110 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_40 = *puVar8;
      lStack_38 = plVar4[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *puVar8;
      local_50 = (ulong *)*plVar4;
    }
    local_48 = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    nite::IP_Port::operator_cast_to_string
              (&local_98,
               (IP_Port *)
               ((long)iVar3.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                      ._M_cur + 0x38));
    uVar10 = 0xf;
    if (local_50 != &local_40) {
      uVar10 = local_40;
    }
    if (uVar10 < local_98._M_string_length + local_48) {
      uVar6 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        uVar6 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < local_98._M_string_length + local_48) goto LAB_001947df;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_50);
    }
    else {
LAB_001947df:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_98._M_dataplus._M_p);
    }
    local_70 = &local_60;
    puVar1 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar1) {
      local_60 = *puVar1;
      uStack_58 = puVar5[3];
    }
    else {
      local_60 = *puVar1;
      local_70 = (undefined8 *)*puVar5;
    }
    local_68 = puVar5[1];
    *puVar5 = puVar1;
    puVar5[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_138 = &local_128;
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_128 = *plVar7;
      lStack_120 = plVar4[3];
    }
    else {
      local_128 = *plVar7;
      local_138 = (long *)*plVar4;
    }
    local_130 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_138,
                                *(ulong *)((long)iVar3.
                                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                                                 ._M_cur + 0x60));
    local_158 = &local_148;
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_148 = *plVar7;
      lStack_140 = plVar4[3];
    }
    else {
      local_148 = *plVar7;
      local_158 = (long *)*plVar4;
    }
    local_150 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_158);
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_188 = *puVar8;
      lStack_180 = plVar4[3];
      local_198 = &local_188;
    }
    else {
      local_188 = *puVar8;
      local_198 = (ulong *)*plVar4;
    }
    local_190 = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    pcVar11 = (pointer)((ulong)pcVar11 & 0xffffffff);
    local_78 = path;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_198);
    psVar9 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_178.field_2._M_allocated_capacity = *psVar9;
      local_178.field_2._8_8_ = plVar4[3];
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar9;
      local_178._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_178._M_string_length = plVar4[1];
    *plVar4 = (long)psVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    nite::print(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if (local_198 != &local_188) {
      operator_delete(local_198);
    }
    unaff_R13 = &local_40;
    if (local_158 != &local_148) {
      operator_delete(local_158);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (local_50 != unaff_R13) {
      operator_delete(local_50);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8);
    }
    path = local_78;
    if ((undefined1 *)check.field_2._8_8_ != &stack0xfffffffffffffe58) {
      operator_delete((void *)check.field_2._8_8_);
      path = local_78;
    }
  }
  local_178._M_dataplus._M_p._0_1_ = (char)pcVar11;
  if (*(long *)((long)iVar3.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                      ._M_cur + 0x300) == 0) {
    uVar6 = std::__throw_bad_function_call();
    if (local_178._M_dataplus._M_p != pcVar11) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if (local_198 != unaff_R13) {
      operator_delete(local_198);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8);
    }
    if ((undefined1 *)check.field_2._8_8_ != &stack0xfffffffffffffe58) {
      operator_delete((void *)check.field_2._8_8_);
    }
    if (local_1d8 != (undefined1  [8])&check._M_string_length) {
      operator_delete((void *)local_1d8);
    }
    _Unwind_Resume(uVar6);
  }
  (**(code **)((long)iVar3.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                     ._M_cur + 0x308))
            ((long)iVar3.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                   ._M_cur + 0x2f0,path,&local_178);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)client,
             (long)iVar3.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                   ._M_cur + 8);
  if (local_1d8 != (undefined1  [8])&check._M_string_length) {
    operator_delete((void *)local_1d8);
  }
LAB_00194b2d:
  pthread_mutex_unlock((pthread_mutex_t *)(ftSessionMutex + 1));
  return;
}

Assistant:

static void finishFTSession(const String &id, nite::FileTransfer::UDPClient *client){
	pthread_mutex_lock(&ftSessionMutex[1]); 
	auto it = client->sessions.find(id);
	if(it != client->sessions.end()){
		it->second.close();
		auto &ref = it->second;
		String check = nite::hashFile(ref.indexed.path);
		bool chksm = check == ref.indexed.hash;		
		if(!ref.sender){
			nite::print("FT "+ref.id+" finished file '"+ref.indexed.hash+"' "+(ref.sender ? "to" : "from")+" "+String(ref.ip)+" saved as '"+ref.indexed.path+"': checksum match: "+(chksm ? "true" : "false"));
		}
		it->second.callback(it->second.indexed, chksm);
		client->sessions.erase(it->first);
	}
	pthread_mutex_unlock(&ftSessionMutex[1]);
}